

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GRULayerParams::Clear(GRULayerParams *this)

{
  WeightParams *pWVar1;
  Arena *pAVar2;
  uint32_t cached_has_bits;
  GRULayerParams *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::Clear
            (&this->activations_);
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar2 == (Arena *)0x0) && (this->updategateweightmatrix_ != (WeightParams *)0x0)) &&
     (pWVar1 = this->updategateweightmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  this->updategateweightmatrix_ = (WeightParams *)0x0;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar2 == (Arena *)0x0) && (this->resetgateweightmatrix_ != (WeightParams *)0x0)) &&
     (pWVar1 = this->resetgateweightmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  this->resetgateweightmatrix_ = (WeightParams *)0x0;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar2 == (Arena *)0x0) && (this->outputgateweightmatrix_ != (WeightParams *)0x0)) &&
     (pWVar1 = this->outputgateweightmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  this->outputgateweightmatrix_ = (WeightParams *)0x0;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar2 == (Arena *)0x0) && (this->updategaterecursionmatrix_ != (WeightParams *)0x0)) &&
     (pWVar1 = this->updategaterecursionmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  this->updategaterecursionmatrix_ = (WeightParams *)0x0;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar2 == (Arena *)0x0) && (this->resetgaterecursionmatrix_ != (WeightParams *)0x0)) &&
     (pWVar1 = this->resetgaterecursionmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  this->resetgaterecursionmatrix_ = (WeightParams *)0x0;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar2 == (Arena *)0x0) && (this->outputgaterecursionmatrix_ != (WeightParams *)0x0)) &&
     (pWVar1 = this->outputgaterecursionmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  this->outputgaterecursionmatrix_ = (WeightParams *)0x0;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar2 == (Arena *)0x0) && (this->updategatebiasvector_ != (WeightParams *)0x0)) &&
     (pWVar1 = this->updategatebiasvector_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  this->updategatebiasvector_ = (WeightParams *)0x0;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar2 == (Arena *)0x0) && (this->resetgatebiasvector_ != (WeightParams *)0x0)) &&
     (pWVar1 = this->resetgatebiasvector_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  this->resetgatebiasvector_ = (WeightParams *)0x0;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar2 == (Arena *)0x0) && (this->outputgatebiasvector_ != (WeightParams *)0x0)) &&
     (pWVar1 = this->outputgatebiasvector_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  this->outputgatebiasvector_ = (WeightParams *)0x0;
  memset(&this->inputvectorsize_,0,0x13);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void GRULayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.GRULayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  activations_.Clear();
  if (GetArenaForAllocation() == nullptr && updategateweightmatrix_ != nullptr) {
    delete updategateweightmatrix_;
  }
  updategateweightmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && resetgateweightmatrix_ != nullptr) {
    delete resetgateweightmatrix_;
  }
  resetgateweightmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && outputgateweightmatrix_ != nullptr) {
    delete outputgateweightmatrix_;
  }
  outputgateweightmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && updategaterecursionmatrix_ != nullptr) {
    delete updategaterecursionmatrix_;
  }
  updategaterecursionmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && resetgaterecursionmatrix_ != nullptr) {
    delete resetgaterecursionmatrix_;
  }
  resetgaterecursionmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && outputgaterecursionmatrix_ != nullptr) {
    delete outputgaterecursionmatrix_;
  }
  outputgaterecursionmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && updategatebiasvector_ != nullptr) {
    delete updategatebiasvector_;
  }
  updategatebiasvector_ = nullptr;
  if (GetArenaForAllocation() == nullptr && resetgatebiasvector_ != nullptr) {
    delete resetgatebiasvector_;
  }
  resetgatebiasvector_ = nullptr;
  if (GetArenaForAllocation() == nullptr && outputgatebiasvector_ != nullptr) {
    delete outputgatebiasvector_;
  }
  outputgatebiasvector_ = nullptr;
  ::memset(&inputvectorsize_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&reverseinput_) -
      reinterpret_cast<char*>(&inputvectorsize_)) + sizeof(reverseinput_));
  _internal_metadata_.Clear<std::string>();
}